

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O1

bool DecodeBase58(char *psz,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
                 int max_ret_len)

{
  pointer *ppuVar1;
  byte bVar2;
  iterator __position;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b256;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (; ((byte)*psz - 9 < 5 || (*psz == 0x20)); psz = (char *)((byte *)psz + 1)) {
  }
  iVar13 = 0;
  if (*psz == 0x31) {
    uVar4 = 0;
    iVar14 = 0;
    if (0 < max_ret_len) {
      iVar14 = max_ret_len;
    }
    do {
      if (iVar14 == (int)uVar4) {
        bVar7 = false;
        goto LAB_0066e4b4;
      }
      uVar12 = uVar4 + 1;
      lVar3 = uVar4 + 1;
      uVar4 = uVar12;
    } while (((byte *)psz)[lVar3] == 0x31);
    psz = (char *)((byte *)psz + uVar12);
  }
  else {
    uVar12 = 0;
  }
  sVar5 = strlen(psz);
  iVar14 = (int)((sVar5 * 0x2dd) / 1000) + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50,(long)iVar14,&local_51);
  do {
    uVar4 = (ulong)(byte)*psz;
    if ((uVar4 < 0x21) && ((0x100003e01U >> (uVar4 & 0x3f) & 1) != 0)) goto LAB_0066e41a;
    iVar8 = (int)mapBase58[uVar4];
    bVar7 = false;
    if (iVar8 != -1) {
      iVar6 = 0;
      if ((*psz != 0x31 || 0 < iVar13) &&
         (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start)) {
        iVar6 = 0;
        pbVar9 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          pbVar9 = pbVar9 + -1;
          uVar11 = (uint)*pbVar9 * 0x3a + iVar8 + 0xff;
          uVar10 = (uint)*pbVar9 * 0x3a + iVar8;
          *pbVar9 = (byte)uVar10;
          if ((int)uVar10 < 0) {
            uVar10 = uVar11;
          }
          iVar8 = (int)uVar10 >> 8;
          iVar6 = iVar6 + 1;
        } while ((0x1fe < uVar11 || iVar6 < iVar13) &&
                (pbVar9 != local_50.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start));
      }
      iVar13 = iVar6;
      if (iVar8 != 0) {
        __assert_fail("carry == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/base58.cpp"
                      ,0x45,"bool DecodeBase58(const char *, std::vector<unsigned char> &, int)");
      }
      bVar7 = iVar13 + (int)uVar12 <= max_ret_len;
      psz = (char *)((byte *)psz + bVar7);
    }
  } while (bVar7);
LAB_0066e497:
  bVar7 = false;
LAB_0066e499:
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0066e4b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
LAB_0066e41a:
  for (; (bVar2 = *psz, bVar2 - 9 < 5 || (bVar2 == 0x20)); psz = (char *)((byte *)psz + 1)) {
  }
  if (bVar2 == 0) {
    pbVar9 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (iVar14 - iVar13);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (vch,(size_type)
                   (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   ((uVar12 & 0xffffffff) - (long)pbVar9)));
    local_51 = (allocator_type)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
              (vch,uVar12 & 0xffffffff,(value_type_conflict *)&local_51);
    bVar7 = true;
    for (; pbVar9 != local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      __position._M_current =
           (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)vch,__position,pbVar9);
      }
      else {
        *__position._M_current = *pbVar9;
        ppuVar1 = &(vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    goto LAB_0066e499;
  }
  goto LAB_0066e497;
}

Assistant:

[[nodiscard]] static bool DecodeBase58(const char* psz, std::vector<unsigned char>& vch, int max_ret_len)
{
    // Skip leading spaces.
    while (*psz && IsSpace(*psz))
        psz++;
    // Skip and count leading '1's.
    int zeroes = 0;
    int length = 0;
    while (*psz == '1') {
        zeroes++;
        if (zeroes > max_ret_len) return false;
        psz++;
    }
    // Allocate enough space in big-endian base256 representation.
    int size = strlen(psz) * 733 /1000 + 1; // log(58) / log(256), rounded up.
    std::vector<unsigned char> b256(size);
    // Process the characters.
    static_assert(std::size(mapBase58) == 256, "mapBase58.size() should be 256"); // guarantee not out of range
    while (*psz && !IsSpace(*psz)) {
        // Decode base58 character
        int carry = mapBase58[(uint8_t)*psz];
        if (carry == -1)  // Invalid b58 character
            return false;
        int i = 0;
        for (std::vector<unsigned char>::reverse_iterator it = b256.rbegin(); (carry != 0 || i < length) && (it != b256.rend()); ++it, ++i) {
            carry += 58 * (*it);
            *it = carry % 256;
            carry /= 256;
        }
        assert(carry == 0);
        length = i;
        if (length + zeroes > max_ret_len) return false;
        psz++;
    }
    // Skip trailing spaces.
    while (IsSpace(*psz))
        psz++;
    if (*psz != 0)
        return false;
    // Skip leading zeroes in b256.
    std::vector<unsigned char>::iterator it = b256.begin() + (size - length);
    // Copy result into output vector.
    vch.reserve(zeroes + (b256.end() - it));
    vch.assign(zeroes, 0x00);
    while (it != b256.end())
        vch.push_back(*(it++));
    return true;
}